

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

TimeSpec __thiscall QDateTime::timeSpec(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    pQVar1 = (QDateTimePrivate *)
             (ulong)(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  return (TimeSpec)((ulong)pQVar1 >> 4) & TimeZone;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}